

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QWindow_*>::begin(QList<QWindow_*> *this)

{
  QWindow **n;
  QArrayDataPointer<QWindow_*> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QWindow_*> *)0x2e4899);
  QArrayDataPointer<QWindow_*>::operator->(in_RDI);
  n = QArrayDataPointer<QWindow_*>::begin((QArrayDataPointer<QWindow_*> *)0x2e48aa);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }